

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

string * __thiscall
pbrt::FormattingScene::upgradeMaterial
          (string *__return_storage_ptr__,FormattingScene *this,string *name,
          ParameterDictionary *dict,FileLoc loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ParsedParameter *pPVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  int iVar7;
  undefined8 *puVar8;
  Allocator AVar9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  ParsedParameter *pPVar13;
  undefined8 uVar14;
  ParsedParameter *pPVar15;
  char *paramName;
  _Alloc_hider _Var16;
  Float value;
  string m1;
  string m2;
  string ret;
  optional<pbrt::RGB> rgb;
  Float avg;
  anon_class_24_3_a769f4f6 removeParamSilentIfConstant;
  string extra;
  string ret_3;
  string local_128;
  undefined1 local_108 [8];
  float local_100;
  uint uStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [4];
  float local_b4;
  float local_b0;
  char local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [40];
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_f8._16_8_ = dict;
  local_f8._24_8_ = name;
  upgradeMaterialIndex((string *)local_70,this,name,dict,loc);
  uVar14 = local_f8._16_8_;
  paVar1 = &local_128.field_2;
  local_128._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"bumpmap","");
  local_108 = (undefined1  [8])local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"displacement","");
  ParameterDictionary::RenameParameter((ParameterDictionary *)uVar14,&local_128,(string *)local_108)
  ;
  if (local_108 != (undefined1  [8])local_f8) {
    operator_delete((void *)local_108,
                    (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != paVar1) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  local_98._16_8_ = local_f8 + 0x10;
  local_98._32_8_ = local_f8 + 0x18;
  local_98._24_8_ = (ParsedParameter *)&loc;
  iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
  if (iVar7 == 0) {
    std::__cxx11::string::_M_replace
              (local_f8._24_8_,0,(char *)((string *)local_f8._24_8_)->_M_string_length,0x2c8d0d1);
    bVar6 = upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                      ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Ks",0.0);
    if (bVar6) {
      std::__cxx11::string::_M_replace
                (local_f8._24_8_,0,(char *)((string *)local_f8._24_8_)->_M_string_length,0x2c8d0d7);
      uVar14 = local_f8._16_8_;
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"eta","");
      ParameterDictionary::RemoveFloat((ParameterDictionary *)uVar14,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_f8._16_8_;
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"roughness","");
      ParameterDictionary::RemoveFloat((ParameterDictionary *)uVar14,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
    upgradeMaterial::anon_class_24_3_a769f4f6::operator()
              ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Kr",0.0);
    upgradeMaterial::anon_class_24_3_a769f4f6::operator()
              ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Kt",0.0);
    uVar14 = local_f8._16_8_;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Kd","");
    local_108 = (undefined1  [8])local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"reflectance","");
    ParameterDictionary::RenameParameter
              ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,
                      (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_f8._16_8_;
    local_108 = (undefined1  [8])local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"opacity","");
    ParameterDictionary::GetTexture(&local_128,(ParameterDictionary *)uVar14,(string *)local_108);
    sVar4 = local_128._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_108 != (undefined1  [8])local_f8) {
      operator_delete((void *)local_108,
                      (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
    }
    uVar14 = local_f8._16_8_;
    if (sVar4 != 0) {
      (this->super_SceneRepresentation).errorExit = true;
      Error(&loc,
            "Non-opaque \"opacity\" texture in \"uber\" material not supported in pbrt-v4. Please edit the file manually."
           );
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0038fd3d;
    }
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"opacity","");
    AVar9.memoryResource = pstd::pmr::new_delete_resource();
    ParameterDictionary::GetSpectrumArray
              ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)local_108,
               (ParameterDictionary *)uVar14,&local_128,Unbounded,AVar9);
    auVar5 = local_108;
    pcVar3 = (pointer)CONCAT44(uStack_fc,local_100);
    if (local_108 != (undefined1  [8])0x0) {
      operator_delete((void *)local_108,local_f8._0_8_ - (long)local_108);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_f8._16_8_;
    if (auVar5 == (undefined1  [8])pcVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0038fd3d;
    }
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"opacity","");
    ParameterDictionary::GetOneRGB((ParameterDictionary *)local_108,(string *)uVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    uVar14 = local_f8._16_8_;
    if ((char)uStack_fc == '\x01') {
      if (((float)local_108._0_4_ == 1.0) && (!NAN((float)local_108._0_4_))) {
        if (((float)local_108._4_4_ == 1.0) &&
           (((!NAN((float)local_108._4_4_) && (local_100 == 1.0)) && (!NAN(local_100))))) {
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"opacity","");
          ParameterDictionary::RemoveSpectrum((ParameterDictionary *)uVar14,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
          if ((char)uStack_fc == '\x01') {
            uStack_fc = uStack_fc & 0xffffff00;
          }
          goto LAB_0038fd3d;
        }
      }
    }
    (this->super_SceneRepresentation).errorExit = true;
    Error(&loc,
          "A non-opaque \"opacity\" in the \"uber\" material is not supported in pbrt-v4. Please edit the file manually."
         );
    if ((char)uStack_fc == '\x01') {
      uStack_fc = uStack_fc & 0xffffff00;
    }
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
    uVar14 = local_f8._16_8_;
    if (iVar7 == 0) {
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"amount","");
      ParameterDictionary::GetOneRGB((ParameterDictionary *)local_b8,(string *)uVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_f8._16_8_;
      if (local_ac == '\x01') {
        if ((((float)local_b8 != local_b4) || (local_b4 != local_b0)) ||
           (NAN(local_b4) || NAN(local_b0))) {
          local_a8._0_4_ = ((float)local_b8 + local_b4 + local_b0) / 3.0;
          local_128._M_string_length = 0;
          local_128.field_2._M_allocated_capacity =
               local_128.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<float&,float&,float&,float&>
                    (&local_128,"Changing RGB \"amount\" (%f, %f, %f) to scalar average %f",
                     (float *)local_b8,(float *)(local_b8 + 4),&local_b0,(float *)local_a8);
          Warning(&loc,local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_108,
                     (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
          local_d8._8_8_ = (ParsedParameter *)0x0;
          local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
          local_d8._0_8_ = (ParsedParameter *)(local_d8 + 0x10);
          detail::stringPrintfRecursive<float&>
                    ((string *)(local_f8 + 0x20),"\"float amount\" [ %f ]\n",(float *)local_a8);
          pPVar2 = (ParsedParameter *)
                   ((long)&(((string *)local_d8._8_8_)->_M_dataplus)._M_p +
                   CONCAT44(uStack_fc,local_100));
          pPVar13 = (ParsedParameter *)0xf;
          if (local_108 != (undefined1  [8])local_f8) {
            pPVar13 = (ParsedParameter *)local_f8._0_8_;
          }
          if (pPVar13 < pPVar2) {
            pPVar13 = (ParsedParameter *)0xf;
            if ((ParsedParameter *)local_d8._0_8_ != (ParsedParameter *)(local_d8 + 0x10)) {
              pPVar13 = (ParsedParameter *)local_d8._16_8_;
            }
            if (pPVar13 < pPVar2) goto LAB_0038f559;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)(local_f8 + 0x20),0,(char *)0x0,(ulong)local_108);
          }
          else {
LAB_0038f559:
            puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_108,local_d8._0_8_);
          }
          puVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128.field_2._8_8_ = puVar8[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_128._M_string_length = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)puVar12 = 0;
          std::__cxx11::string::_M_append(local_70,(ulong)local_128._M_dataplus._M_p);
        }
        else {
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_108,
                     (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
          if (local_ac == '\0') {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
          }
          local_d8._8_8_ = (ParsedParameter *)0x0;
          local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
          local_d8._0_8_ = (ParsedParameter *)(local_d8 + 0x10);
          detail::stringPrintfRecursive<float&>
                    ((string *)(local_f8 + 0x20),"\"float amount\" [ %f ]\n",(float *)local_b8);
          pPVar2 = (ParsedParameter *)
                   ((long)&(((string *)local_d8._8_8_)->_M_dataplus)._M_p +
                   CONCAT44(uStack_fc,local_100));
          pPVar13 = (ParsedParameter *)0xf;
          if (local_108 != (undefined1  [8])local_f8) {
            pPVar13 = (ParsedParameter *)local_f8._0_8_;
          }
          if (pPVar13 < pPVar2) {
            pPVar13 = (ParsedParameter *)0xf;
            if ((ParsedParameter *)local_d8._0_8_ != (ParsedParameter *)(local_d8 + 0x10)) {
              pPVar13 = (ParsedParameter *)local_d8._16_8_;
            }
            if (pPVar13 < pPVar2) goto LAB_0038f0e8;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)(local_f8 + 0x20),0,(char *)0x0,(ulong)local_108);
          }
          else {
LAB_0038f0e8:
            puVar8 = (undefined8 *)std::__cxx11::string::_M_append(local_108,local_d8._0_8_);
          }
          puVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128.field_2._8_8_ = puVar8[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_128._M_string_length = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)puVar12 = 0;
          std::__cxx11::string::_M_append(local_70,(ulong)local_128._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_d8._16_8_;
        _Var16._M_p = (pointer)local_d8._0_8_;
        if ((ParsedParameter *)local_d8._0_8_ != (ParsedParameter *)(local_d8 + 0x10)) {
LAB_0038f84a:
          operator_delete(_Var16._M_p,
                          (ulong)((long)&(((ParsedParameter *)uVar14)->type)._M_dataplus._M_p + 1));
        }
LAB_0038f852:
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,
                          (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
        }
      }
      else {
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"amount","");
        AVar9.memoryResource = pstd::pmr::new_delete_resource();
        ParameterDictionary::GetSpectrumArray
                  ((vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> *)local_108,
                   (ParameterDictionary *)uVar14,&local_128,Unbounded,AVar9);
        auVar5 = local_108;
        pcVar3 = (pointer)CONCAT44(uStack_fc,local_100);
        if (local_108 != (undefined1  [8])0x0) {
          operator_delete((void *)local_108,local_f8._0_8_ - (long)local_108);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        uVar14 = local_f8._16_8_;
        if ((undefined1  [8])pcVar3 != auVar5) {
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"amount","");
          ParameterDictionary::ToParameterDefinition
                    (&local_128,(ParameterDictionary *)uVar14,(string *)local_108);
          SceneRepresentation::ErrorExitDeferred<std::__cxx11::string>
                    (&this->super_SceneRepresentation,&loc,
                     "Unable to update non-RGB spectrum \"amount\" to a scalar: %s",&local_128);
          uVar14 = local_128.field_2._M_allocated_capacity;
          _Var16._M_p = local_128._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) goto LAB_0038f84a;
          goto LAB_0038f852;
        }
      }
      uVar14 = local_f8._16_8_;
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"amount","");
      ParameterDictionary::RemoveSpectrum((ParameterDictionary *)uVar14,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      uVar14 = local_f8._16_8_;
      local_108 = (undefined1  [8])local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"namedmaterial1","");
      pPVar2 = (ParsedParameter *)(local_d8 + 0x10);
      local_d8._0_8_ = pPVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_f8 + 0x20),"");
      ParameterDictionary::GetOneString
                (&local_128,(ParameterDictionary *)uVar14,(string *)local_108,
                 (string *)(local_f8 + 0x20));
      if ((ParsedParameter *)local_d8._0_8_ != pPVar2) {
        operator_delete((void *)local_d8._0_8_,
                        (ulong)((long)&(((string *)local_d8._16_8_)->_M_dataplus)._M_p + 1));
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,
                        (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
      }
      if (local_128._M_string_length == 0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"Didn\'t find \"namedmaterial1\" parameter for \"mix\" material.");
      }
      uVar14 = local_f8._16_8_;
      local_108 = (undefined1  [8])local_f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"namedmaterial1","");
      ParameterDictionary::RemoveString((ParameterDictionary *)uVar14,(string *)local_108);
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,
                        (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
      }
      uVar14 = local_f8._16_8_;
      local_d8._0_8_ = pPVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_f8 + 0x20),"namedmaterial2","");
      local_a8._0_8_ = (ParsedParameter *)local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
      ParameterDictionary::GetOneString
                ((string *)local_108,(ParameterDictionary *)uVar14,(string *)(local_f8 + 0x20),
                 (string *)local_a8);
      if ((ParsedParameter *)local_a8._0_8_ != (ParsedParameter *)local_98) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
      }
      if ((ParsedParameter *)local_d8._0_8_ != pPVar2) {
        operator_delete((void *)local_d8._0_8_,
                        (ulong)((long)&(((string *)local_d8._16_8_)->_M_dataplus)._M_p + 1));
      }
      if (CONCAT44(uStack_fc,local_100) == 0) {
        (this->super_SceneRepresentation).errorExit = true;
        Error(&loc,"Didn\'t find \"namedmaterial1\" parameter for \"mix\" material.");
      }
      uVar14 = local_f8._16_8_;
      local_d8._0_8_ = pPVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_f8 + 0x20),"namedmaterial2","");
      ParameterDictionary::RemoveString((ParameterDictionary *)uVar14,(string *)(local_f8 + 0x20));
      if ((ParsedParameter *)local_d8._0_8_ != pPVar2) {
        operator_delete((void *)local_d8._0_8_,
                        (ulong)((long)&(((string *)local_d8._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_a8._0_8_ = (ParsedParameter *)local_98;
      std::__cxx11::string::_M_construct
                ((ulong)local_a8,
                 (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
      local_50._8_8_ = 0;
      local_40._M_local_buf[0] = '\0';
      local_50._M_allocated_capacity = (size_type)&local_40;
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string&>
                ((string *)&local_50,"\"string materials\" [ \"%s\" \"%s\" ]\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 &local_128);
      pPVar13 = (ParsedParameter *)
                ((long)&(((string *)local_a8._8_8_)->_M_dataplus)._M_p + local_50._8_8_);
      pPVar15 = (ParsedParameter *)0xf;
      if ((ParsedParameter *)local_a8._0_8_ != (ParsedParameter *)local_98) {
        pPVar15 = (ParsedParameter *)local_98._0_8_;
      }
      if (pPVar15 < pPVar13) {
        pPVar15 = (ParsedParameter *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          pPVar15 = (ParsedParameter *)
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
        }
        if (pPVar15 < pPVar13) goto LAB_0038fb2e;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,local_a8._0_8_);
      }
      else {
LAB_0038fb2e:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append(local_a8,local_50._M_allocated_capacity);
      }
      pPVar13 = (ParsedParameter *)(puVar8 + 2);
      if ((ParsedParameter *)*puVar8 == pPVar13) {
        local_d8._16_8_ = (pPVar13->type)._M_dataplus._M_p;
        local_d8._24_8_ = puVar8[3];
        local_d8._0_8_ = pPVar2;
      }
      else {
        local_d8._16_8_ = (pPVar13->type)._M_dataplus._M_p;
        local_d8._0_8_ = (ParsedParameter *)*puVar8;
      }
      local_d8._8_8_ = puVar8[1];
      *puVar8 = pPVar13;
      puVar8[1] = 0;
      *(undefined1 *)&(pPVar13->type)._M_dataplus._M_p = 0;
      std::__cxx11::string::_M_append(local_70,local_d8._0_8_);
      if ((ParsedParameter *)local_d8._0_8_ != pPVar2) {
        operator_delete((void *)local_d8._0_8_,
                        (ulong)((long)&(((string *)local_d8._16_8_)->_M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_allocated_capacity != &local_40) {
        operator_delete((void *)local_50._M_allocated_capacity,
                        CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1)
        ;
      }
      if ((ParsedParameter *)local_a8._0_8_ != (ParsedParameter *)local_98) {
        operator_delete((void *)local_a8._0_8_,(ulong)(local_98._0_8_ + 1));
      }
      if (local_108 != (undefined1  [8])local_f8) {
        operator_delete((void *)local_108,
                        (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (local_ac == '\x01') {
        local_ac = '\0';
      }
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
      if (iVar7 == 0) {
        std::__cxx11::string::_M_replace
                  (local_f8._24_8_,0,(char *)((string *)local_f8._24_8_)->_M_string_length,0x2c8d0d1
                  );
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Ks",1.0);
        uVar14 = local_f8._16_8_;
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Kd","");
        local_108 = (undefined1  [8])local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"reflectance","");
        ParameterDictionary::RenameParameter
                  ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
        goto LAB_0038fcb6;
      }
      iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
      if (iVar7 == 0) {
        std::__cxx11::string::_M_replace
                  (local_f8._24_8_,0,(char *)((string *)local_f8._24_8_)->_M_string_length,0x2c8d107
                  );
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Kr",1.0);
        paramName = "Kt";
        value = 1.0;
LAB_0038f43b:
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),paramName,value);
        goto LAB_0038fce4;
      }
      iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
      if (iVar7 == 0) {
        std::__cxx11::string::_M_replace
                  (local_f8._24_8_,0,(char *)((string *)local_f8._24_8_)->_M_string_length,0x2c8d0d1
                  );
        bVar6 = upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                          ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Ks",0.0);
        if (bVar6) {
          std::__cxx11::string::operator=((string *)local_f8._24_8_,"diffuse");
          uVar14 = local_f8._16_8_;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"roughness","");
          ParameterDictionary::RemoveFloat((ParameterDictionary *)uVar14,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          uVar14 = local_f8._16_8_;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"eta","");
          ParameterDictionary::RemoveFloat((ParameterDictionary *)uVar14,&local_128);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
        uVar14 = local_f8._16_8_;
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Kd","");
        local_108 = (undefined1  [8])local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"reflectance","");
        ParameterDictionary::RenameParameter
                  ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
        goto LAB_0038fcb6;
      }
      iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
      if (iVar7 == 0) {
        Warning(&loc,"\"fourier\" material is no longer supported. (But there is \"measured\"!)");
        goto LAB_0038fce4;
      }
      iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
      if (iVar7 == 0) {
        std::__cxx11::string::operator=((string *)local_f8._24_8_,"subsurface");
        uVar14 = local_f8._16_8_;
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Kd","");
        local_108 = (undefined1  [8])local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"reflectance","");
        ParameterDictionary::RenameParameter
                  ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
LAB_0038fcb6:
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,
                          (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
        }
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
        if (iVar7 == 0) {
          std::__cxx11::string::operator=((string *)local_f8._24_8_,"diffuse");
          uVar14 = local_f8._16_8_;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Kd","");
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"reflectance","");
          ParameterDictionary::RenameParameter
                    ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
          goto LAB_0038fcb6;
        }
        iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
        if (iVar7 == 0) {
          std::__cxx11::string::operator=((string *)local_f8._24_8_,"conductor");
          value = 1.0;
LAB_003900bd:
          paramName = "Kr";
          goto LAB_0038f43b;
        }
        iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
        if (iVar7 != 0) {
          iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
          if (iVar7 != 0) {
            iVar7 = std::__cxx11::string::compare((char *)local_f8._24_8_);
            if (iVar7 != 0) goto LAB_0038fce4;
            std::__cxx11::string::operator=((string *)local_f8._24_8_,"diffuse");
            uVar14 = local_f8._16_8_;
            local_128._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"color","");
            local_108 = (undefined1  [8])local_f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"reflectance","");
            ParameterDictionary::RenameParameter
                      ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
            goto LAB_0038fcb6;
          }
          std::__cxx11::string::operator=((string *)local_f8._24_8_,"conductor");
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_108,
                     (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
          plVar10 = (long *)std::__cxx11::string::append(local_108);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_128.field_2._M_allocated_capacity = *psVar11;
            local_128.field_2._8_8_ = plVar10[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar11;
            local_128._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_128._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append(local_70,(ulong)local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_108 != (undefined1  [8])local_f8) {
            operator_delete((void *)local_108,
                            (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
          }
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_108,
                     (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
          plVar10 = (long *)std::__cxx11::string::append(local_108);
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_128.field_2._M_allocated_capacity = *psVar11;
            local_128.field_2._8_8_ = plVar10[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = *psVar11;
            local_128._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_128._M_string_length = plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append(local_70,(ulong)local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_108 != (undefined1  [8])local_f8) {
            operator_delete((void *)local_108,
                            (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
          }
          local_108 = (undefined1  [8])local_f8;
          std::__cxx11::string::_M_construct
                    ((ulong)local_108,
                     (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
          plVar10 = (long *)std::__cxx11::string::append(local_108);
          puVar12 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128.field_2._8_8_ = plVar10[3];
            local_128._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_128.field_2._M_allocated_capacity = *puVar12;
            local_128._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_128._M_string_length = plVar10[1];
          *plVar10 = (long)puVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append(local_70,(ulong)local_128._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if (local_108 != (undefined1  [8])local_f8) {
            operator_delete((void *)local_108,
                            (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
          }
          value = 0.0;
          goto LAB_003900bd;
        }
        std::__cxx11::string::operator=((string *)local_f8._24_8_,"diffusetransmission");
        uVar14 = local_f8._16_8_;
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Kd","");
        local_108 = (undefined1  [8])local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"transmittance","");
        ParameterDictionary::RenameParameter
                  ((ParameterDictionary *)uVar14,&local_128,(string *)local_108);
        if (local_108 != (undefined1  [8])local_f8) {
          operator_delete((void *)local_108,
                          (ulong)((long)&(((string *)local_f8._0_8_)->_M_dataplus)._M_p + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != paVar1) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"reflect",0.0);
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"transmit",1.0);
        upgradeMaterial::anon_class_24_3_a769f4f6::operator()
                  ((anon_class_24_3_a769f4f6 *)(local_98 + 0x10),"Ks",0.0);
        uVar14 = local_f8._16_8_;
        local_128._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"roughness","");
        ParameterDictionary::RemoveFloat((ParameterDictionary *)uVar14,&local_128);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_0038fce4:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._0_8_ == &local_60) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_60._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70._0_8_;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_70._8_8_;
  local_70._8_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  local_70._0_8_ = &local_60;
LAB_0038fd3d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._0_8_ != &local_60) {
    operator_delete((void *)local_70._0_8_,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormattingScene::upgradeMaterial(std::string *name, ParameterDictionary *dict,
                                             FileLoc loc) const {
    std::string extra = upgradeMaterialIndex(*name, dict, loc);

    dict->RenameParameter("bumpmap", "displacement");

    auto removeParamSilentIfConstant = [&](const char *paramName, Float value) {
        pstd::optional<RGB> rgb = dict->GetOneRGB(paramName);
        bool matches = (rgb && rgb->r == value && rgb->g == value && rgb->b == value);

        if (!matches &&
            !dict->GetSpectrumArray(paramName, SpectrumType::Unbounded, {}).empty())
            Warning(&loc,
                    "Parameter is being removed when converting "
                    "to \"%s\" material: %s",
                    *name, dict->ToParameterDefinition(paramName));
        dict->RemoveSpectrum(paramName);
        dict->RemoveTexture(paramName);
        return matches;
    };

    if (*name == "uber") {
        *name = "coateddiffuse";
        if (removeParamSilentIfConstant("Ks", 0)) {
            *name = "diffuse";
            dict->RemoveFloat("eta");
            dict->RemoveFloat("roughness");
        }
        removeParamSilentIfConstant("Kr", 0);
        removeParamSilentIfConstant("Kt", 0);
        dict->RenameParameter("Kd", "reflectance");

        if (!dict->GetTexture("opacity").empty()) {
            ErrorExitDeferred(&loc, "Non-opaque \"opacity\" texture in \"uber\" "
                                    "material not supported "
                                    "in pbrt-v4. Please edit the file manually.");
            return "";
        }

        if (dict->GetSpectrumArray("opacity", SpectrumType::Unbounded, {}).empty())
            return "";

        pstd::optional<RGB> opacity = dict->GetOneRGB("opacity");
        if (opacity && opacity->r == 1 && opacity->g == 1 && opacity->b == 1) {
            dict->RemoveSpectrum("opacity");
            return "";
        }

        ErrorExitDeferred(&loc, "A non-opaque \"opacity\" in the \"uber\" "
                                "material is not supported "
                                "in pbrt-v4. Please edit the file manually.");
    } else if (*name == "mix") {
        // Convert the amount to a scalar
        pstd::optional<RGB> rgb = dict->GetOneRGB("amount");
        if (rgb) {
            if (rgb->r == rgb->g && rgb->g == rgb->b)
                extra += indent(1) + StringPrintf("\"float amount\" [ %f ]\n", rgb->r);
            else {
                Float avg = (rgb->r + rgb->g + rgb->b) / 3;
                Warning(&loc, "Changing RGB \"amount\" (%f, %f, %f) to scalar average %f",
                        rgb->r, rgb->g, rgb->b, avg);
                extra += indent(1) + StringPrintf("\"float amount\" [ %f ]\n", avg);
            }
        } else if (dict->GetSpectrumArray("amount", SpectrumType::Unbounded, {}).size() >
                   0)
            ErrorExitDeferred(
                &loc, "Unable to update non-RGB spectrum \"amount\" to a scalar: %s",
                dict->ToParameterDefinition("amount"));

        dict->RemoveSpectrum("amount");

        // And rename...
        std::string m1 = dict->GetOneString("namedmaterial1", "");
        if (m1.empty())
            ErrorExitDeferred(
                &loc, "Didn't find \"namedmaterial1\" parameter for \"mix\" material.");
        dict->RemoveString("namedmaterial1");

        std::string m2 = dict->GetOneString("namedmaterial2", "");
        if (m2.empty())
            ErrorExitDeferred(
                &loc, "Didn't find \"namedmaterial1\" parameter for \"mix\" material.");
        dict->RemoveString("namedmaterial2");

        // Note: swapped order vs pbrt-v3!
        extra +=
            indent(1) + StringPrintf("\"string materials\" [ \"%s\" \"%s\" ]\n", m2, m1);
    } else if (*name == "substrate") {
        *name = "coateddiffuse";
        removeParamSilentIfConstant("Ks", 1);
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "glass") {
        *name = "dielectric";
        removeParamSilentIfConstant("Kr", 1);
        removeParamSilentIfConstant("Kt", 1);
    } else if (*name == "plastic") {
        *name = "coateddiffuse";
        if (removeParamSilentIfConstant("Ks", 0)) {
            *name = "diffuse";
            dict->RemoveFloat("roughness");
            dict->RemoveFloat("eta");
        }
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "fourier")
        Warning(&loc, "\"fourier\" material is no longer supported. (But there "
                      "is \"measured\"!)");
    else if (*name == "kdsubsurface") {
        *name = "subsurface";
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "matte") {
        *name = "diffuse";
        dict->RenameParameter("Kd", "reflectance");
    } else if (*name == "metal") {
        *name = "conductor";
        removeParamSilentIfConstant("Kr", 1);
    } else if (*name == "translucent") {
        *name = "diffusetransmission";

        dict->RenameParameter("Kd", "transmittance");

        removeParamSilentIfConstant("reflect", 0);
        removeParamSilentIfConstant("transmit", 1);

        removeParamSilentIfConstant("Ks", 0);
        dict->RemoveFloat("roughness");
    } else if (*name == "mirror") {
        *name = "conductor";
        extra += indent(1) + "\"float roughness\" [ 0 ]\n";
        extra += indent(1) + "\"spectrum eta\" [ \"metal-Ag-eta\" ]\n";
        extra += indent(1) + "\"spectrum k\" [ \"metal-Ag-k\" ]\n";

        removeParamSilentIfConstant("Kr", 0);
    } else if (*name == "disney") {
        *name = "diffuse";
        dict->RenameParameter("color", "reflectance");
    }

    return extra;
}